

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall basisu::basisu_frontend::init_endpoint_training_vectors(basisu_frontend *this)

{
  uint uVar1;
  function<void_()> *in_RDI;
  uint32_t last_index;
  uint32_t first_index;
  uint32_t block_index_iter;
  uint32_t N;
  array_of_weighted_training_vecs *training_vecs;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 grow_hint;
  size_t in_stack_ffffffffffffff88;
  function<void_()> *job;
  uint uVar2;
  basisu_frontend *in_stack_ffffffffffffffc0;
  uint local_18;
  
  grow_hint = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  debug_printf("init_endpoint_training_vectors\n");
  tree_vector_quant<basisu::vec<6U,_float>_>::get_training_vecs
            ((tree_vector_quant<basisu::vec<6U,_float>_> *)&in_RDI[4]._M_invoker);
  vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_>::resize
            ((vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_> *)in_RDI,
             in_stack_ffffffffffffff88,(bool)grow_hint);
  for (local_18 = 0; local_18 < *(uint *)&in_RDI[2].super__Function_base._M_functor;
      local_18 = local_18 + 0x4000) {
    uVar1 = minimum<unsigned_int>
                      (*(uint *)&in_RDI[2].super__Function_base._M_functor,local_18 + 0x4000);
    job = in_RDI;
    uVar2 = local_18;
    std::function<void()>::
    function<basisu::basisu_frontend::init_endpoint_training_vectors()::__0,void>
              (in_RDI,(anon_class_24_4_0ba9f15f *)&stack0xffffffffffffffc0);
    job_pool::add_job((job_pool *)CONCAT44(uVar1,uVar2),job);
    std::function<void_()>::~function((function<void_()> *)0x4e0910);
  }
  job_pool::wait_for_all((job_pool *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void basisu_frontend::init_endpoint_training_vectors()
	{
		debug_printf("init_endpoint_training_vectors\n");
								
		vec6F_quantizer::array_of_weighted_training_vecs &training_vecs = m_endpoint_clusterizer.get_training_vecs();
		
		training_vecs.resize(m_total_blocks * 2);

		const uint32_t N = 16384;
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job( [this, first_index, last_index, &training_vecs] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{			
					const etc_block &blk = m_etc1_blocks_etc1s[block_index];

					color_rgba block_colors[2];
					blk.get_block_low_high_colors(block_colors, 0);
				
					vec6F v;
					v[0] = block_colors[0].r * (1.0f / 255.0f);
					v[1] = block_colors[0].g * (1.0f / 255.0f);
					v[2] = block_colors[0].b * (1.0f / 255.0f);
					v[3] = block_colors[1].r * (1.0f / 255.0f);
					v[4] = block_colors[1].g * (1.0f / 255.0f);
					v[5] = block_colors[1].b * (1.0f / 255.0f);
				
					training_vecs[block_index * 2 + 0] = std::make_pair(v, 1);
					training_vecs[block_index * 2 + 1] = std::make_pair(v, 1);

				} // block_index;

#ifndef __EMSCRIPTEN__
			} );
#endif

		} // block_index_iter

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif
	}